

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.c
# Opt level: O1

faup_snapshot_value_count_t * faup_snapshot_value_count_new(void)

{
  faup_snapshot_value_count_t *pfVar1;
  
  pfVar1 = (faup_snapshot_value_count_t *)malloc(0x20);
  if (pfVar1 != (faup_snapshot_value_count_t *)0x0) {
    pfVar1->last_time_seen = 0;
    pfVar1->count = 0;
    pfVar1->value = (char *)0x0;
    pfVar1->first_time_seen = 0;
    return pfVar1;
  }
  faup_snapshot_value_count_new_cold_1();
  return (faup_snapshot_value_count_t *)0x0;
}

Assistant:

faup_snapshot_value_count_t *faup_snapshot_value_count_new(void)
{
  faup_snapshot_value_count_t *vc;

  vc = malloc(sizeof(faup_snapshot_value_count_t));
  if (!vc) {
    fprintf(stderr, "Error: cannot allocate faup_snapshot_value_count_t\n");
    return NULL;
  }
  vc->value = NULL;
  vc->first_time_seen = 0;
  vc->last_time_seen = 0;
  vc->count = 0;

  return vc;
}